

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTexture.cpp
# Opt level: O0

bool __thiscall
sf::RenderTexture::create(RenderTexture *this,uint width,uint height,ContextSettings *settings)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ulong uVar4;
  RenderTarget *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  RenderTextureImplFBO *in_stack_00000020;
  uint in_stack_000000e0;
  uint in_stack_000000e4;
  Texture *in_stack_000000e8;
  undefined1 in_stack_ffffffffffffffaf;
  RenderTexture *in_stack_ffffffffffffffb0;
  RenderTextureImplDefault *this_00;
  bool local_1;
  
  Texture::setSrgb((Texture *)(in_RDI + 0x1e8),
                   (bool)(*(byte *)&(in_RCX->m_defaultView).m_rotation & 1));
  bVar1 = Texture::create(in_stack_000000e8,in_stack_000000e4,in_stack_000000e0);
  if (bVar1) {
    setSmooth(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
    this_00 = *(RenderTextureImplDefault **)(in_RDI + 0x1e0);
    if (this_00 != (RenderTextureImplDefault *)0x0) {
      (*(this_00->super_RenderTextureImpl)._vptr_RenderTextureImpl[1])();
    }
    bVar1 = priv::RenderTextureImplFBO::isAvailable();
    if (bVar1) {
      pvVar3 = operator_new(0x88);
      priv::RenderTextureImplFBO::RenderTextureImplFBO(in_stack_00000020);
      *(void **)(in_RDI + 0x1e0) = pvVar3;
      *(undefined1 *)(in_RDI + 0x200) = 1;
    }
    else {
      pvVar3 = operator_new(0x18);
      priv::RenderTextureImplDefault::RenderTextureImplDefault(this_00);
      *(void **)(in_RDI + 0x1e0) = pvVar3;
    }
    uVar4 = (**(code **)(**(long **)(in_RDI + 0x1e0) + 0x10))
                      (*(long **)(in_RDI + 0x1e0),in_ESI,in_EDX,*(undefined4 *)(in_RDI + 0x1f8),
                       in_RCX);
    if ((uVar4 & 1) == 0) {
      local_1 = false;
    }
    else {
      RenderTarget::initialize(in_RCX);
      local_1 = true;
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Impossible to create render texture (failed to create the target texture)"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RenderTexture::create(unsigned int width, unsigned int height, const ContextSettings& settings)
{
    // Set texture to be in sRGB scale if requested
    m_texture.setSrgb(settings.sRgbCapable);

    // Create the texture
    if (!m_texture.create(width, height))
    {
        err() << "Impossible to create render texture (failed to create the target texture)" << std::endl;
        return false;
    }

    // We disable smoothing by default for render textures
    setSmooth(false);

    // Create the implementation
    delete m_impl;
    if (priv::RenderTextureImplFBO::isAvailable())
    {
        // Use frame-buffer object (FBO)
        m_impl = new priv::RenderTextureImplFBO;

        // Mark the texture as being a framebuffer object attachment
        m_texture.m_fboAttachment = true;
    }
    else
    {
        // Use default implementation
        m_impl = new priv::RenderTextureImplDefault;
    }

    // Initialize the render texture
    if (!m_impl->create(width, height, m_texture.m_texture, settings))
        return false;

    // We can now initialize the render target part
    RenderTarget::initialize();

    return true;
}